

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

bool __thiscall Query::operator==(Query *this,Query *other)

{
  bool bVar1;
  
  if (this->type == other->type) {
    bVar1 = std::operator==(&this->value,&other->value);
    if (bVar1) {
      bVar1 = std::operator==(&this->queries,&other->queries);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Query::operator==(const Query &other) const {
    return type == other.type && value == other.value &&
           queries == other.queries;
}